

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

PrimitiveInstanceSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PrimitiveInstanceSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::PrimitiveSymbol_const&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,PrimitiveSymbol *args_2)

{
  SourceLocation SVar1;
  size_t sVar2;
  char *pcVar3;
  PrimitiveInstanceSymbol *pPVar4;
  
  pPVar4 = (PrimitiveInstanceSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((PrimitiveInstanceSymbol *)this->endPtr < pPVar4 + 1) {
    pPVar4 = (PrimitiveInstanceSymbol *)allocateSlow(this,0x80,8);
  }
  else {
    this->head->current = (byte *)(pPVar4 + 1);
  }
  sVar2 = args->_M_len;
  pcVar3 = args->_M_str;
  SVar1 = *args_1;
  (pPVar4->super_InstanceSymbolBase).super_Symbol.kind = PrimitiveInstance;
  (pPVar4->super_InstanceSymbolBase).super_Symbol.name._M_len = sVar2;
  (pPVar4->super_InstanceSymbolBase).super_Symbol.name._M_str = pcVar3;
  (pPVar4->super_InstanceSymbolBase).super_Symbol.location = SVar1;
  (pPVar4->super_InstanceSymbolBase).super_Symbol.parentScope = (Scope *)0x0;
  (pPVar4->super_InstanceSymbolBase).super_Symbol.nextInScope = (Symbol *)0x0;
  (pPVar4->super_InstanceSymbolBase).super_Symbol.indexInScope = 0;
  (pPVar4->super_InstanceSymbolBase).super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (pPVar4->super_InstanceSymbolBase).arrayPath._M_ptr = (pointer)0x0;
  (pPVar4->super_InstanceSymbolBase).arrayPath._M_extent._M_extent_value = 0;
  pPVar4->primitiveType = args_2;
  (pPVar4->ports).
  super__Optional_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>,_true,_true>
  ._M_payload.
  super__Optional_payload_base<std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>_>
  ._M_engaged = false;
  (pPVar4->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
  super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged = false;
  return pPVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }